

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O2

int32_t packDiff(int32_t diff)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  short sVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  
  if (diff < -0x40) {
    if ((uint)diff < 0xffffd6ef) {
      if ((uint)diff < 0xfffd22f4) {
        uVar6 = (-diff - 0x2dd0cU) % 0xf3;
        uVar3 = 0xf3 - uVar6;
        if (uVar6 == 0) {
          uVar3 = 0;
        }
        uVar6 = (uint)(uVar6 != 0) + (-diff - 0x2dd0cU) / 0xf3;
        if (uVar3 < 0x14) {
          uVar3 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar3];
        }
        else {
          uVar3 = uVar3 + 0xd;
        }
        uVar4 = uVar6 / 0xf3;
        uVar6 = uVar6 % 0xf3;
        uVar2 = 0xf3 - uVar6;
        uVar9 = ~uVar4;
        if (uVar6 == 0) {
          uVar2 = 0;
          uVar9 = -uVar4;
        }
        if (uVar2 < 0x14) {
          iVar10 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar2];
        }
        else {
          iVar10 = uVar2 + 0xd;
        }
        if ((int)uVar9 < -0xdf) {
          iVar5 = (int)_ISCIIStaticData.name[(long)(int)uVar9 + 0x3b];
        }
        else {
          iVar5 = uVar9 + 0x100;
        }
        return uVar3 | iVar10 << 8 | iVar5 << 0x10 | 0x21000000;
      }
      uVar6 = (-diff - 0x2911U) % 0xf3;
      uVar3 = 0xf3 - uVar6;
      if (uVar6 == 0) {
        uVar3 = 0;
      }
      if (uVar3 < 0x14) {
        uVar3 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [uVar3];
      }
      else {
        uVar3 = uVar3 + 0xd;
      }
      uVar6 = (uint)(uVar6 != 0) + (-diff - 0x2911U) / 0xf3 & 0xffff;
      uVar9 = uVar6 / 0xf3;
      uVar6 = uVar6 % 0xf3;
      uVar4 = 0xf3 - uVar6;
      uVar2 = ~uVar9;
      if ((short)uVar6 == 0) {
        uVar4 = 0;
        uVar2 = -uVar9;
      }
      if ((ushort)uVar4 < 0x14) {
        uVar6 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [uVar4 & 0xffff];
      }
      else {
        uVar6 = uVar4 + 0xd & 0xffff;
      }
      uVar3 = uVar2 * 0x10000 + 0x250000 | uVar3 | uVar6 << 8;
      goto LAB_002ad373;
    }
    uVar3 = -diff - 0x40U & 0xffff;
    uVar6 = uVar3 / 0xf3;
    uVar3 = uVar3 % 0xf3;
    uVar2 = 0xf3 - uVar3;
    uVar9 = ~uVar6;
    if ((short)uVar3 == 0) {
      uVar2 = 0;
      uVar9 = -uVar6;
    }
    if ((ushort)uVar2 < 0x14) {
      uVar3 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                    [uVar2 & 0xffff];
    }
    else {
      uVar3 = uVar2 + 0xd & 0xffff;
    }
    uVar6 = uVar9 * 0x100 + 0x5000;
  }
  else {
    if (0x2910 < diff) {
      if (0x2dd0b < (uint)diff) {
        uVar6 = diff - 0x2dd0c;
        uVar1 = (ulong)uVar6 % 0xf3;
        uVar3 = (uint)uVar1;
        if (uVar3 < 0x14) {
          uVar3 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar1];
        }
        else {
          uVar3 = uVar3 + 0xd;
        }
        uVar1 = ((ulong)uVar6 / 0xf3) % 0xf3;
        uVar9 = (uint)uVar1;
        if (uVar9 < 0x14) {
          iVar10 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                        [uVar1];
        }
        else {
          iVar10 = uVar9 + 0xd;
        }
        if (uVar6 < 0x120534) {
          iVar5 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                       [(ulong)uVar6 / 0xe6a9];
        }
        else {
          iVar5 = (int)((ulong)uVar6 / 0xe6a9) + 0xd;
        }
        return uVar3 | iVar10 << 8 | iVar5 << 0x10 | 0xfe000000;
      }
      uVar6 = diff - 0x2911;
      uVar1 = (ulong)uVar6 % 0xf3;
      uVar3 = (uint)uVar1;
      if (uVar3 < 0x14) {
        uVar3 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [uVar1];
      }
      else {
        uVar3 = uVar3 + 0xd;
      }
      uVar9 = (uint)(ushort)((ulong)uVar6 / 0xf3) % 0xf3;
      uVar8 = (ushort)uVar9;
      if (uVar8 < 0x14) {
        iVar10 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [uVar8];
      }
      else {
        iVar10 = uVar9 + 0xd;
      }
      uVar3 = (uVar6 / 0xe6a9) * 0x10000 + 0xfb0000 | uVar3 | iVar10 << 8;
LAB_002ad373:
      return uVar3 | 0x3000000;
    }
    uVar6 = (uint)(ushort)((short)(diff - 0x40U) >> 0xf) << 0x10 | diff - 0x40U & 0xffff;
    sVar7 = (short)((int)uVar6 % 0xf3);
    if (sVar7 < 0x14) {
      uVar3 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                    [sVar7];
    }
    else {
      uVar3 = (uint)(ushort)(sVar7 + 0xd);
    }
    uVar6 = ((int)uVar6 / 0xf3 & 0xffffU) * 0x100 + 0xd000;
  }
  return uVar6 | uVar3 | 0x2000000;
}

Assistant:

static int32_t
packDiff(int32_t diff) {
    int32_t result, m;

    U_ASSERT(!DIFF_IS_SINGLE(diff)); /* assume we won't be called where diff==BOCU1_REACH_NEG_1=-64 */
    if(diff>=BOCU1_REACH_NEG_1) {
        /* mostly positive differences, and single-byte negative ones */
#if 0   /* single-byte case handled in macros, see below */
        if(diff<=BOCU1_REACH_POS_1) {
            /* single byte */
            return 0x01000000|(BOCU1_MIDDLE+diff);
        } else
#endif
        if(diff<=BOCU1_REACH_POS_2) {
            /* two bytes */
            diff-=BOCU1_REACH_POS_1+1;
            result=0x02000000;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m);

            result|=(BOCU1_START_POS_2+diff)<<8;
        } else if(diff<=BOCU1_REACH_POS_3) {
            /* three bytes */
            diff-=BOCU1_REACH_POS_2+1;
            result=0x03000000;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m);

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            result|=(BOCU1_START_POS_3+diff)<<16;
        } else {
            /* four bytes */
            diff-=BOCU1_REACH_POS_3+1;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result=BOCU1_TRAIL_TO_BYTE(m);

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            /*
             * We know that / and % would deliver quotient 0 and rest=diff.
             * Avoid division and modulo for performance.
             */
            result|=BOCU1_TRAIL_TO_BYTE(diff)<<16;

            result|=((uint32_t)BOCU1_START_POS_4)<<24;
        }
    } else {
        /* two- to four-byte negative differences */
        if(diff>=BOCU1_REACH_NEG_2) {
            /* two bytes */
            diff-=BOCU1_REACH_NEG_1;
            result=0x02000000;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m);

            result|=(BOCU1_START_NEG_2+diff)<<8;
        } else if(diff>=BOCU1_REACH_NEG_3) {
            /* three bytes */
            diff-=BOCU1_REACH_NEG_2;
            result=0x03000000;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m);

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            result|=(BOCU1_START_NEG_3+diff)<<16;
        } else {
            /* four bytes */
            diff-=BOCU1_REACH_NEG_3;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result=BOCU1_TRAIL_TO_BYTE(m);

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            /*
             * We know that NEGDIVMOD would deliver
             * quotient -1 and rest=diff+BOCU1_TRAIL_COUNT.
             * Avoid division and modulo for performance.
             */
            m=diff+BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<16;

            result|=BOCU1_MIN<<24;
        }
    }
    return result;
}